

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O2

polynomial_t polynomial_create_from_roots(field_t field,uint nroots,field_element_t *roots)

{
  field_element_t *__ptr;
  field_element_t *__ptr_00;
  field_element_t *__ptr_01;
  ulong uVar1;
  undefined4 in_register_00000014;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong __nmemb;
  polynomial_t pVar5;
  polynomial_t pVar6;
  polynomial_t l;
  polynomial_t r_00;
  polynomial_t r [2];
  
  pVar6._12_4_ = in_register_00000014;
  pVar6.order = nroots;
  pVar5 = polynomial_create(nroots);
  pVar6.coeff = pVar5.coeff;
  uVar2 = 1;
  __ptr = (field_element_t *)calloc(2,1);
  __nmemb = (ulong)(nroots + 1);
  __ptr_00 = (field_element_t *)calloc(__nmemb,1);
  r[0].coeff = __ptr_00;
  __ptr_01 = (field_element_t *)calloc(__nmemb,1);
  r[1].coeff = __ptr_01;
  *__ptr_00 = *roots;
  __ptr_00[1] = '\x01';
  r[0].order = 1;
  __ptr[1] = '\x01';
  uVar4 = 0;
  while (uVar2 < nroots) {
    *__ptr = roots[uVar2];
    uVar3 = ~(uint)uVar4 & 1;
    uVar2 = uVar2 + 1;
    uVar1 = (ulong)(uVar3 << 4);
    *(int *)((long)&r[0].order + uVar1) = (int)uVar2;
    pVar5._8_8_ = *(undefined8 *)((long)&r[0].order + uVar1);
    pVar5.coeff = *(field_element_t **)((long)&r[0].coeff + uVar1);
    l._8_8_ = 1;
    l.coeff = __ptr;
    r_00.order = r[uVar4].order;
    r_00.coeff = r[uVar4].coeff;
    r_00._12_4_ = 0;
    polynomial_mul(field,l,r_00,pVar5);
    uVar4 = (ulong)uVar3;
  }
  memcpy(pVar6.coeff,r[uVar4].coeff,__nmemb);
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return pVar6;
}

Assistant:

polynomial_t polynomial_create_from_roots(field_t field, unsigned int nroots, field_element_t *roots) {
    polynomial_t poly = polynomial_create(nroots);
    unsigned int order = nroots;
    polynomial_t l;
    l.order = 1;
    l.coeff = calloc(2, sizeof(field_element_t));

    polynomial_t r[2];
    // we'll keep two temporary stores of rightside polynomial
    // each time through the loop, we take the previous result and use it as new rightside
    // swap back and forth (prevents the need for a copy)
    r[0].coeff = calloc(order + 1, sizeof(field_element_t));
    r[1].coeff = calloc(order + 1, sizeof(field_element_t));
    unsigned int rcoeffres = 0;

    // initialize the result with x + roots[0]
    r[rcoeffres].coeff[0] = roots[0];
    r[rcoeffres].coeff[1] = 1;
    r[rcoeffres].order = 1;

    // initialize lcoeff[1] with x
    // we'll fill in the 0th order term in each loop iter
    l.coeff[1] = 1;

    // loop through, using previous run's result as the new right hand side
    // this allows us to multiply one group at a time
    for (unsigned int i = 1; i < nroots; i++) {
        l.coeff[0] = roots[i];
        unsigned int nextrcoeff = rcoeffres;
        rcoeffres = (rcoeffres + 1) % 2;
        r[rcoeffres].order = i + 1;
        polynomial_mul(field, l, r[nextrcoeff], r[rcoeffres]);
    }

    memcpy(poly.coeff, r[rcoeffres].coeff, (order + 1) * sizeof(field_element_t));
    poly.order = order;

    free(l.coeff);
    free(r[0].coeff);
    free(r[1].coeff);

    return poly;
}